

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cx_string.hpp
# Opt level: O2

cx_string<8UL> mserialize::cx_strcat<4ul,4ul>(cx_string<4UL> *strings,cx_string<4UL> *strings_1)

{
  char *pcVar1;
  size_t i;
  long lVar2;
  size_t s;
  ulong uVar3;
  char buffer [9];
  ulong auStack_58 [4];
  long lStack_38;
  cx_string<4UL> *local_30;
  cx_string<4UL> *local_28;
  cx_string<8UL> local_18;
  
  pcVar1 = buffer;
  buffer[0] = '\0';
  buffer[1] = '\0';
  buffer[2] = '\0';
  buffer[3] = '\0';
  buffer[4] = '\0';
  buffer[5] = '\0';
  buffer[6] = '\0';
  buffer[7] = '\0';
  buffer[8] = '\0';
  local_30 = strings;
  local_28 = strings_1;
  auStack_58[1] = 4;
  auStack_58[2] = 4;
  for (lVar2 = 1; lVar2 != 3; lVar2 = lVar2 + 1) {
    for (uVar3 = 0; uVar3 < auStack_58[lVar2]; uVar3 = uVar3 + 1) {
      pcVar1[uVar3] = *(undefined1 *)((&lStack_38)[lVar2] + uVar3);
    }
    pcVar1 = pcVar1 + uVar3;
  }
  cx_string<8UL>::cx_string(&local_18,buffer);
  return (cx_string<8UL>)local_18._data;
}

Assistant:

constexpr auto cx_strcat(const cx_string<N>&&... strings)
{
  char buffer[detail::sum<N...>()+1] = {0};
  const char* data[] = {"", strings.data()...};
  const std::size_t size[] = {0, strings.size()...};

  char* out = buffer;
  for (std::size_t i = 1; i <= sizeof...(N); ++i)
  {
    for (std::size_t s = 0; s < size[i]; ++s) { *out++ = data[i][s]; } // NOLINT
  }

  return cx_string<sizeof(buffer)-1>(buffer);
}